

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

pqpair tnonc_s2pq(double t,double df,double delta)

{
  int iVar1;
  double dVar2;
  double __x;
  double p;
  double p_00;
  double q;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double ab1;
  pqpair pq;
  double error;
  double cons;
  double sum;
  double delosq2;
  double rempois;
  double term;
  double qtermb;
  double ptermb;
  double qtermf;
  double ptermf;
  double qbetab;
  double qbetaf;
  double pbetab;
  double pbetaf;
  double qgamb;
  double qgamf;
  double pgamb;
  double pgamf;
  double qkb;
  double qkf;
  double pkb;
  double pkf;
  double c;
  double b;
  double a;
  double dels;
  double y;
  double ans;
  double tnd;
  double del;
  double x;
  int i;
  int k;
  int indx;
  double delta_local;
  double df_local;
  double t_local;
  double local_10;
  
  if (0.0 < df) {
    if (1e-08 <= ABS(delta)) {
      tnd = delta;
      del = t;
      if (0.0 > t) {
        del = -t;
        tnd = -delta;
      }
      t_local = gaudf(-tnd);
      if ((del != 0.0) || (NAN(del))) {
        delta_local = df;
        if ((df == 1.0) && (!NAN(df))) {
          delta_local = 1.0000001;
        }
        dVar2 = (del * del) / (del * del + delta_local);
        __x = tnd * 0.5 * tnd;
        iVar1 = (int)__x;
        p = (double)iVar1 + 0.5;
        p_00 = (double)iVar1 + 1.0;
        q = delta_local * 0.5;
        dVar3 = log(__x);
        dVar4 = alng((double)iVar1 + 1.0);
        qkf = exp(((double)iVar1 * dVar3 + -__x) - dVar4);
        dVar3 = log(__x);
        dVar4 = alng((double)iVar1 + 1.0 + 0.5);
        pgamf = exp(((double)iVar1 * dVar3 + -__x) - dVar4);
        qbetaf = betadf(dVar2,p,q);
        ptermf = betadf(dVar2,p_00,q);
        dVar3 = (p + q) - 1.0;
        if (dVar3 <= 0.0) {
          dVar4 = alng(p + q);
          dVar5 = alng(p);
          dVar6 = alng(q);
          dVar7 = log(dVar2);
          dVar8 = log(1.0 - dVar2);
          dVar4 = exp(q * dVar8 + (p - 1.0) * dVar7 + ((dVar4 - dVar5) - dVar6));
          pgamb = dVar4 / dVar3;
        }
        else {
          dVar4 = alng(dVar3);
          dVar5 = alng(p);
          dVar6 = alng(q);
          dVar7 = log(dVar2);
          dVar8 = log(1.0 - dVar2);
          pgamb = exp(q * dVar8 + (p - 1.0) * dVar7 + ((dVar4 - dVar5) - dVar6));
        }
        qgamf = (pgamb * dVar2 * dVar3) / p;
        dVar3 = alng((p_00 + q) - 1.0);
        dVar4 = alng(p_00);
        dVar5 = alng(q);
        dVar6 = log(dVar2);
        dVar7 = log(1.0 - dVar2);
        qgamb = exp(q * dVar7 + (p_00 - 1.0) * dVar6 + ((dVar3 - dVar4) - dVar5));
        pbetaf = (qgamb * dVar2 * ((p_00 + q) - 1.0)) / p_00;
        delosq2 = 1.0 - qkf;
        dVar3 = tnd / 1.4142135623731;
        cons = qkf * qbetaf + dVar3 * pgamf * ptermf;
        x._4_4_ = 0;
        qbetab = ptermf;
        pbetab = qbetaf;
        qkb = pgamf;
        pkb = qkf;
        do {
          while( true ) {
            x._4_4_ = x._4_4_ + 1;
            pgamb = (pgamb * dVar2 * ((p + q + (double)x._4_4_) - 2.0)) /
                    ((p + (double)x._4_4_) - 1.0);
            pbetab = pbetab - pgamb;
            pkb = (pkb * __x) / (double)(iVar1 + x._4_4_);
            qgamb = (qgamb * dVar2 * ((p_00 + q + (double)x._4_4_) - 2.0)) /
                    ((p_00 + (double)x._4_4_) - 1.0);
            qbetab = qbetab - qgamb;
            qkb = (qkb * __x) / (((double)(iVar1 + x._4_4_) - 1.0) + 1.5);
            cons = cons + dVar3 * qkb * qbetab + pkb * pbetab;
            dVar4 = delosq2 * (ABS(delta) * 0.5 + 1.0) * 0.5;
            delosq2 = delosq2 - pkb;
            if (iVar1 < x._4_4_) break;
            qgamf = (qgamf * ((p - (double)x._4_4_) + 1.0)) / (dVar2 * ((p + q) - (double)x._4_4_));
            qbetaf = qbetaf + qgamf;
            qkf = (((double)(iVar1 - x._4_4_) + 1.0) * qkf) / __x;
            pbetaf = (pbetaf * ((p_00 - (double)x._4_4_) + 1.0)) /
                     (dVar2 * ((p_00 + q) - (double)x._4_4_));
            ptermf = ptermf + pbetaf;
            pgamf = (((double)(iVar1 - x._4_4_) + 1.0 + 0.5) * pgamf) / __x;
            cons = cons + dVar3 * pgamf * ptermf + qkf * qbetaf;
            delosq2 = delosq2 - qkf;
            if ((delosq2 <= 1e-12) || (0x270e < x._4_4_)) goto LAB_0011a165;
          }
        } while ((1e-12 < dVar4 * pbetab) && (x._4_4_ < 9999));
LAB_0011a165:
        dVar2 = cons * 0.5 + t_local;
        if (0.0 <= t) {
          pq.p = 1.0 - dVar2;
          ab1 = dVar2;
        }
        else {
          ab1 = 1.0 - dVar2;
          pq.p = dVar2;
        }
        local_10 = pq.p;
        t_local = ab1;
      }
      else {
        local_10 = 1.0 - t_local;
      }
    }
    else {
      _t_local = student_s2pq(t,df);
    }
  }
  else {
    _t_local = (pqpair)(ZEXT816(0x3ff0000000000000) << 0x40);
  }
  return _t_local;
}

Assistant:

static pqpair tnonc_s2pq( double t , double df , double delta )
{
   int indx , k , i ;
   double x,del,tnd,ans,y,dels,a,b,c ;
   double pkf,pkb,qkf,qkb , pgamf,pgamb,qgamf,qgamb ;
   double pbetaf,pbetab,qbetaf,qbetab ;
   double ptermf,qtermf,ptermb,qtermb,term ;
   double rempois,delosq2,sum,cons,error ;

   pqpair pq={0.0,1.0} ;  /* will be return value */
   double ab1 ;

   /*-- stupid user? --*/

   if( df <= 0.0 ) return pq ;

   /*-- non-centrality = 0? --*/

   if( fabs(delta) < 1.e-8 ) return student_s2pq(t,df) ;

   /*-- start K's code here --*/

   if( t < 0.0 ){ x = -t ; del = -delta ; indx = 1 ; }  /* x will be */
   else         { x =  t ; del =  delta ; indx = 0 ; }  /* positive */

   ans = gaudf(-del) ;  /* prob that x <= 0 = Normal cdf */

   /*-- the nearly trivial case of x=0 --*/

   if( x == 0.0 ){ pq.p = ans; pq.q = 1.0-ans; return pq; }

   if( df == 1.0 ) df = 1.0000001 ;  /** df=1 is BAD **/

   y = x*x/(df+x*x) ;    /* between 0 and 1 */
   dels = 0.5*del*del ;  /* will be positive */
   k = (int)dels ;       /* 0, 1, 2, ... */
   a = k+0.5 ;           /* might be as small as 0.5 */
   c = k+1.0 ;
   b = 0.5*df ;          /* might be as small as 0.0 */

   pkf = exp(-dels+k*log(dels)-alng(k+1.0)) ;
   pkb = pkf ;
   qkf = exp(-dels+k*log(dels)-alng(k+1.0+0.5)) ;
   qkb = qkf ;

   pbetaf = betadf(y, a, b) ;
   pbetab = pbetaf ;
   qbetaf = betadf(y, c, b) ;
   qbetab = qbetaf ;

   ab1 = a+b-1.0 ;  /* might be as small as -0.5 */

   /*-- RWCox: if a+b-1 < 0, log(Gamma(a+b-1)) won't work;
               instead, use Gamma(a+b-1)=Gamma(a+b)/(a+b-1) --*/

   if( ab1 > 0.0 )
     pgamf = exp(alng(ab1)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y)) ;
   else
     pgamf = exp(alng(a+b)-alng(a)-alng(b)+(a-1.0)*log(y)+b*log(1.0-y))/ab1 ;

   pgamb = pgamf*y*(ab1)/a ;

   /*-- we can't have c+b-1 < 0, so the above patchup isn't needed --*/

   qgamf = exp(alng(c+b-1.0)-alng(c)-alng(b)+(c-1.0)*log(y) + b*log(1.0-y)) ;
   qgamb = qgamf*y*(c+b-1.0)/c ;

   rempois = 1.0 - pkf ;
   delosq2 = del/1.4142135623731 ;
   sum = pkf*pbetaf+delosq2*qkf*qbetaf ;
   cons = 0.5*(1.0 + 0.5*fabs(delta)) ;
   i = 0 ;
L1:
   i = i + 1 ;
   pgamf = pgamf*y*(a+b+i-2.0)/(a+i-1.0) ;
   pbetaf = pbetaf - pgamf ;
   pkf = pkf*dels/(k+i) ;
   ptermf = pkf*pbetaf ;
   qgamf = qgamf*y*(c+b+i-2.0)/(c+i-1.0) ;
   qbetaf = qbetaf - qgamf ;
   qkf = qkf*dels/(k+i-1.0+1.5) ;
   qtermf = qkf*qbetaf ;
   term = ptermf + delosq2*qtermf  ;
   sum = sum + term ;
   error = rempois*cons*pbetaf ;
   rempois = rempois - pkf ;

   if( i > k ){
     if( error <= 1.e-12 || i >= 9999 ) goto L2 ;
     goto L1 ;
   } else {
     pgamb = pgamb*(a-i+1.0)/(y*(a+b-i)) ;
     pbetab = pbetab + pgamb ;
     pkb = (k-i+1.0)*pkb/dels ;
     ptermb = pkb*pbetab  ;
     qgamb = qgamb*(c-i+1.0)/(y*(c+b-i)) ;
     qbetab = qbetab + qgamb ;
     qkb = (k-i+1.0+0.5)*qkb/dels ;
     qtermb = qkb*qbetab  ;
     term =  ptermb + delosq2*qtermb ;
     sum = sum + term  ;
     rempois = rempois - pkb ;
     if (rempois <= 1.e-12 || i >= 9999) goto L2 ;
     goto L1 ;
   }
L2:
   tnd = 0.5*sum + ans ;

   /*-- return a pqpair, not just the cdf --*/

   if( indx ){ pq.p = 1.0-tnd; pq.q = tnd    ; }
   else      { pq.p = tnd    ; pq.q = 1.0-tnd; }
   return pq ;
}